

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O3

void __thiscall
llvm::write_double(llvm *this,raw_ostream *S,double N,FloatStyle Style,
                  Optional<unsigned_long> Precision)

{
  SmallVectorStorage<char,_8U> *pSVar1;
  undefined1 *puVar2;
  raw_ostream *prVar3;
  char *__format;
  size_t sVar4;
  int iVar5;
  undefined4 in_register_00000014;
  void *__buf;
  void *__buf_00;
  uint uVar6;
  char *pcVar7;
  int __fd;
  unsigned_long N_00;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  SmallString<8U> Spec;
  char Buf [32];
  raw_svector_ostream Out;
  SmallString<8U> local_a0;
  char local_88 [40];
  raw_ostream local_60;
  SmallString<8U> *local_38;
  
  uVar6 = (uint)S;
  N_00 = (ulong)(uVar6 < 2) * 4 + 2;
  if (((undefined1  [16])Precision.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    N_00 = CONCAT44(in_register_00000014,Style);
  }
  if (NAN(N)) {
    pcVar7 = "nan";
  }
  else {
    if (ABS(N) != INFINITY) {
      iVar5 = 0x66;
      if (uVar6 == 1) {
        iVar5 = 0x45;
      }
      __fd = 0x65;
      if (uVar6 != 0) {
        __fd = iVar5;
      }
      pSVar1 = &local_a0.super_SmallVector<char,_8U>.super_SmallVectorStorage<char,_8U>;
      local_a0.super_SmallVector<char,_8U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size = 0;
      local_a0.super_SmallVector<char,_8U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity = 8;
      local_60.BufferMode = InternalBuffer;
      local_60.OutBufStart = (char *)0x0;
      local_60.OutBufEnd = (char *)0x0;
      local_60.OutBufCur = (char *)0x0;
      local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00184548;
      local_38 = &local_a0;
      local_a0.super_SmallVector<char,_8U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX = pSVar1;
      raw_ostream::SetUnbuffered(&local_60);
      Str_00.Length = 2;
      Str_00.Data = "%.";
      prVar3 = raw_ostream::operator<<(&local_60,Str_00);
      prVar3 = raw_ostream::operator<<(prVar3,N_00);
      pcVar7 = prVar3->OutBufCur;
      if (pcVar7 < prVar3->OutBufEnd) {
        prVar3->OutBufCur = pcVar7 + 1;
        *pcVar7 = (char)__fd;
      }
      else {
        raw_ostream::write(prVar3,__fd,__buf,(size_t)pcVar7);
      }
      if (uVar6 == 3) {
        __format = SmallString<8U>::c_str(&local_a0);
        snprintf(local_88,0x20,__format,N * 100.0);
        sVar4 = strlen(local_88);
        Str_01.Length = sVar4;
        Str_01.Data = local_88;
        raw_ostream::operator<<((raw_ostream *)this,Str_01);
        puVar2 = *(undefined1 **)(this + 0x18);
        if (puVar2 < *(undefined1 **)(this + 0x10)) {
          *(undefined1 **)(this + 0x18) = puVar2 + 1;
          *puVar2 = 0x25;
        }
        else {
          raw_ostream::write((raw_ostream *)this,0x25,__buf_00,(size_t)pcVar7);
        }
      }
      else {
        pcVar7 = SmallString<8U>::c_str(&local_a0);
        snprintf(local_88,0x20,pcVar7,N);
        sVar4 = strlen(local_88);
        Str_02.Length = sVar4;
        Str_02.Data = local_88;
        raw_ostream::operator<<((raw_ostream *)this,Str_02);
      }
      raw_ostream::~raw_ostream(&local_60);
      if ((SmallVectorStorage<char,_8U> *)
          local_a0.super_SmallVector<char,_8U>.super_SmallVectorImpl<char>.
          super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
          super_SmallVectorBase.BeginX != pSVar1) {
        free(local_a0.super_SmallVector<char,_8U>.super_SmallVectorImpl<char>.
             super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
             super_SmallVectorBase.BeginX);
      }
      return;
    }
    pcVar7 = "INF";
  }
  Str.Length = 3;
  Str.Data = pcVar7;
  raw_ostream::operator<<((raw_ostream *)this,Str);
  return;
}

Assistant:

void llvm::write_double(raw_ostream &S, double N, FloatStyle Style,
                        Optional<size_t> Precision) {
  size_t Prec = Precision.getValueOr(getDefaultPrecision(Style));

  if (std::isnan(N)) {
    S << "nan";
    return;
  } else if (std::isinf(N)) {
    S << "INF";
    return;
  }

  char Letter;
  if (Style == FloatStyle::Exponent)
    Letter = 'e';
  else if (Style == FloatStyle::ExponentUpper)
    Letter = 'E';
  else
    Letter = 'f';

  SmallString<8> Spec;
  llvm::raw_svector_ostream Out(Spec);
  Out << "%." << Prec << Letter;

  if (Style == FloatStyle::Exponent || Style == FloatStyle::ExponentUpper) {
#ifdef _WIN32
// On MSVCRT and compatible, output of %e is incompatible to Posix
// by default. Number of exponent digits should be at least 2. "%+03d"
// FIXME: Implement our formatter to here or Support/Format.h!
#if defined(__MINGW32__)
    // FIXME: It should be generic to C++11.
    if (N == 0.0 && std::signbit(N)) {
      char NegativeZero[] = "-0.000000e+00";
      if (Style == FloatStyle::ExponentUpper)
        NegativeZero[strlen(NegativeZero) - 4] = 'E';
      S << NegativeZero;
      return;
    }
#else
    int fpcl = _fpclass(N);

    // negative zero
    if (fpcl == _FPCLASS_NZ) {
      char NegativeZero[] = "-0.000000e+00";
      if (Style == FloatStyle::ExponentUpper)
        NegativeZero[strlen(NegativeZero) - 4] = 'E';
      S << NegativeZero;
      return;
    }
#endif

    char buf[32];
    unsigned len;
    len = format(Spec.c_str(), N).snprint(buf, sizeof(buf));
    if (len <= sizeof(buf) - 2) {
      if (len >= 5 && (buf[len - 5] == 'e' || buf[len - 5] == 'E') &&
          buf[len - 3] == '0') {
        int cs = buf[len - 4];
        if (cs == '+' || cs == '-') {
          int c1 = buf[len - 2];
          int c0 = buf[len - 1];
          if (isdigit(static_cast<unsigned char>(c1)) &&
              isdigit(static_cast<unsigned char>(c0))) {
            // Trim leading '0': "...e+012" -> "...e+12\0"
            buf[len - 3] = c1;
            buf[len - 2] = c0;
            buf[--len] = 0;
          }
        }
      }
      S << buf;
      return;
    }
#endif
  }

  if (Style == FloatStyle::Percent)
    N *= 100.0;

  char Buf[32];
  format(Spec.c_str(), N).snprint(Buf, sizeof(Buf));
  S << Buf;
  if (Style == FloatStyle::Percent)
    S << '%';
}